

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DancingNode.cpp
# Opt level: O0

DancingNode * getMinColumn(DancingNode *header)

{
  DancingNode *local_20;
  DancingNode *min_col;
  DancingNode *h;
  DancingNode *header_local;
  
  local_20 = header->right;
  min_col = header->right->right;
  do {
    if (min_col->nodeCount < local_20->nodeCount) {
      local_20 = min_col;
    }
    min_col = min_col->right;
  } while (min_col != header);
  return local_20;
}

Assistant:

DancingNode *getMinColumn(DancingNode *header) 
{ 
    DancingNode *h = header;
    DancingNode *min_col = h->right; 
    h = h->right->right; 
    do
    { 
        if(h->nodeCount < min_col->nodeCount) 
        { 
            min_col = h; 
        } 
        h = h->right; 
    }while(h != header); 
  
    return min_col; 
}